

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quantile.cpp
# Opt level: O1

Value * duckdb::CheckQuantile(Value *quantile_val)

{
  bool bVar1;
  BinderException *pBVar2;
  double input;
  string local_40;
  
  if (quantile_val->is_null == true) {
    pBVar2 = (BinderException *)__cxa_allocate_exception(0x10);
    local_40._M_dataplus._M_p = (pointer)&local_40.field_2;
    ::std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_40,"QUANTILE parameter cannot be NULL","");
    BinderException::BinderException(pBVar2,&local_40);
    __cxa_throw(pBVar2,&BinderException::typeinfo,::std::runtime_error::~runtime_error);
  }
  input = Value::GetValue<double>(quantile_val);
  if (ABS(input) <= 1.0) {
    bVar1 = Value::IsNan<double>(input);
    if (!bVar1) {
      return quantile_val;
    }
    pBVar2 = (BinderException *)__cxa_allocate_exception(0x10);
    local_40._M_dataplus._M_p = (pointer)&local_40.field_2;
    ::std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_40,"QUANTILE parameter cannot be NaN","");
    BinderException::BinderException(pBVar2,&local_40);
    __cxa_throw(pBVar2,&BinderException::typeinfo,::std::runtime_error::~runtime_error);
  }
  pBVar2 = (BinderException *)__cxa_allocate_exception(0x10);
  local_40._M_dataplus._M_p = (pointer)&local_40.field_2;
  ::std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_40,"QUANTILE can only take parameters in the range [-1, 1]","");
  BinderException::BinderException(pBVar2,&local_40);
  __cxa_throw(pBVar2,&BinderException::typeinfo,::std::runtime_error::~runtime_error);
}

Assistant:

static const Value &CheckQuantile(const Value &quantile_val) {
	if (quantile_val.IsNull()) {
		throw BinderException("QUANTILE parameter cannot be NULL");
	}
	auto quantile = quantile_val.GetValue<double>();
	if (quantile < -1 || quantile > 1) {
		throw BinderException("QUANTILE can only take parameters in the range [-1, 1]");
	}
	if (Value::IsNan(quantile)) {
		throw BinderException("QUANTILE parameter cannot be NaN");
	}

	return quantile_val;
}